

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

uint8 * __thiscall
google::protobuf::FileDescriptorProto::InternalSerializeWithCachedSizesToArray
          (FileDescriptorProto *this,bool deterministic,uint8 *target)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  RepeatedPtrField<google::protobuf::DescriptorProto> *this_01;
  int iVar1;
  string *psVar2;
  char *data;
  FileOptions *this_02;
  SourceCodeInfo *this_03;
  Rep *pRVar3;
  void *pvVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  Type *pTVar8;
  Type *this_04;
  Type *this_05;
  Type *this_06;
  Type *this_07;
  LogMessage *pLVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  undefined7 in_register_00000031;
  ulong uVar14;
  ulong uVar15;
  FileDescriptorProto *pFVar16;
  int iVar17;
  byte *pbVar18;
  LogFinisher local_b1;
  FileDescriptorProto *local_b0;
  undefined4 local_a8;
  uint local_a4;
  LogMessage local_a0;
  LogMessage local_68;
  
  uVar12 = (this->_has_bits_).has_bits_[0];
  local_a8 = (undefined4)CONCAT71(in_register_00000031,deterministic);
  if ((uVar12 & 1) != 0) {
    psVar2 = (this->name_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "google.protobuf.FileDescriptorProto.name");
    psVar2 = (this->name_).ptr_;
    *target = '\n';
    target = io::CodedOutputStream::WriteStringWithSizeToArray(psVar2,target + 1);
  }
  if ((uVar12 & 2) != 0) {
    psVar2 = (this->package_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "google.protobuf.FileDescriptorProto.package");
    psVar2 = (this->package_).ptr_;
    *target = 0x12;
    target = io::CodedOutputStream::WriteStringWithSizeToArray(psVar2,target + 1);
  }
  iVar1 = (this->dependency_).super_RepeatedPtrFieldBase.current_size_;
  local_b0 = this;
  local_a4 = uVar12;
  if (0 < iVar1) {
    this_00 = &this->dependency_;
    iVar17 = 0;
    do {
      pTVar8 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&this_00->super_RepeatedPtrFieldBase,iVar17);
      data = (pTVar8->_M_dataplus)._M_p;
      pTVar8 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&this_00->super_RepeatedPtrFieldBase,iVar17);
      internal::WireFormatLite::VerifyUtf8String
                (data,(int)pTVar8->_M_string_length,SERIALIZE,
                 "google.protobuf.FileDescriptorProto.dependency");
      pTVar8 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&this_00->super_RepeatedPtrFieldBase,iVar17);
      *target = 0x1a;
      target = io::CodedOutputStream::WriteStringWithSizeToArray(pTVar8,target + 1);
      iVar17 = iVar17 + 1;
    } while (iVar1 != iVar17);
  }
  pFVar16 = local_b0;
  iVar1 = (local_b0->message_type_).super_RepeatedPtrFieldBase.current_size_;
  bVar6 = local_a8._0_1_;
  if (iVar1 != 0) {
    this_01 = &local_b0->message_type_;
    iVar17 = 0;
    do {
      this_04 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                          (&this_01->super_RepeatedPtrFieldBase,iVar17);
      *target = 0x22;
      pbVar18 = target + 1;
      uVar12 = this_04->_cached_size_;
      uVar10 = uVar12;
      if (0x7f < uVar12) {
        do {
          *pbVar18 = (byte)uVar12 | 0x80;
          uVar10 = uVar12 >> 7;
          pbVar18 = pbVar18 + 1;
          bVar5 = 0x3fff < uVar12;
          uVar12 = uVar10;
        } while (bVar5);
      }
      *pbVar18 = (byte)uVar10;
      target = DescriptorProto::InternalSerializeWithCachedSizesToArray(this_04,bVar6,pbVar18 + 1);
      iVar17 = iVar17 + 1;
    } while (iVar17 != iVar1);
  }
  iVar1 = (pFVar16->enum_type_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    iVar17 = 0;
    do {
      this_05 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                          (&(pFVar16->enum_type_).super_RepeatedPtrFieldBase,iVar17);
      *target = 0x2a;
      pbVar18 = target + 1;
      uVar12 = this_05->_cached_size_;
      uVar10 = uVar12;
      if (0x7f < uVar12) {
        do {
          *pbVar18 = (byte)uVar12 | 0x80;
          uVar10 = uVar12 >> 7;
          pbVar18 = pbVar18 + 1;
          bVar5 = 0x3fff < uVar12;
          uVar12 = uVar10;
        } while (bVar5);
      }
      *pbVar18 = (byte)uVar10;
      target = EnumDescriptorProto::InternalSerializeWithCachedSizesToArray
                         (this_05,bVar6,pbVar18 + 1);
      iVar17 = iVar17 + 1;
    } while (iVar17 != iVar1);
  }
  iVar1 = (pFVar16->service_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    iVar17 = 0;
    do {
      this_06 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::TypeHandler>
                          (&(pFVar16->service_).super_RepeatedPtrFieldBase,iVar17);
      *target = 0x32;
      pbVar18 = target + 1;
      uVar12 = this_06->_cached_size_;
      uVar10 = uVar12;
      if (0x7f < uVar12) {
        do {
          *pbVar18 = (byte)uVar12 | 0x80;
          uVar10 = uVar12 >> 7;
          pbVar18 = pbVar18 + 1;
          bVar5 = 0x3fff < uVar12;
          uVar12 = uVar10;
        } while (bVar5);
      }
      *pbVar18 = (byte)uVar10;
      target = ServiceDescriptorProto::InternalSerializeWithCachedSizesToArray
                         (this_06,bVar6,pbVar18 + 1);
      iVar17 = iVar17 + 1;
    } while (iVar17 != iVar1);
  }
  iVar1 = (pFVar16->extension_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    iVar17 = 0;
    do {
      this_07 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                          (&(pFVar16->extension_).super_RepeatedPtrFieldBase,iVar17);
      *target = 0x3a;
      pbVar18 = target + 1;
      uVar12 = this_07->_cached_size_;
      uVar10 = uVar12;
      if (0x7f < uVar12) {
        do {
          *pbVar18 = (byte)uVar12 | 0x80;
          uVar10 = uVar12 >> 7;
          pbVar18 = pbVar18 + 1;
          bVar5 = 0x3fff < uVar12;
          uVar12 = uVar10;
        } while (bVar5);
      }
      *pbVar18 = (byte)uVar10;
      target = FieldDescriptorProto::InternalSerializeWithCachedSizesToArray
                         (this_07,bVar6,pbVar18 + 1);
      iVar17 = iVar17 + 1;
    } while (iVar17 != iVar1);
  }
  uVar12 = local_a4;
  if ((local_a4 & 8) != 0) {
    this_02 = pFVar16->options_;
    *target = 0x42;
    pbVar18 = target + 1;
    uVar10 = this_02->_cached_size_;
    uVar7 = uVar10;
    if (0x7f < uVar10) {
      do {
        *pbVar18 = (byte)uVar10 | 0x80;
        uVar7 = uVar10 >> 7;
        pbVar18 = pbVar18 + 1;
        bVar5 = 0x3fff < uVar10;
        uVar10 = uVar7;
      } while (bVar5);
    }
    *pbVar18 = (byte)uVar7;
    target = FileOptions::InternalSerializeWithCachedSizesToArray(this_02,bVar6,pbVar18 + 1);
  }
  if ((uVar12 & 0x10) != 0) {
    this_03 = pFVar16->source_code_info_;
    *target = 0x4a;
    pbVar18 = target + 1;
    uVar10 = this_03->_cached_size_;
    uVar7 = uVar10;
    if (0x7f < uVar10) {
      do {
        *pbVar18 = (byte)uVar10 | 0x80;
        uVar7 = uVar10 >> 7;
        pbVar18 = pbVar18 + 1;
        bVar6 = 0x3fff < uVar10;
        uVar10 = uVar7;
      } while (bVar6);
    }
    *pbVar18 = (byte)uVar7;
    target = SourceCodeInfo::InternalSerializeWithCachedSizesToArray(this_03,false,pbVar18 + 1);
  }
  uVar10 = (pFVar16->public_dependency_).current_size_;
  if (uVar10 != 0) {
    if ((pFVar16->public_dependency_).rep_ == (Rep *)0x0) {
      internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x4e2);
      pLVar9 = internal::LogMessage::operator<<(&local_68,"CHECK failed: rep_: ");
      internal::LogFinisher::operator=((LogFinisher *)&local_a0,pLVar9);
      internal::LogMessage::~LogMessage(&local_68);
    }
    pRVar3 = (local_b0->public_dependency_).rep_;
    uVar11 = 1;
    if (1 < (int)uVar10) {
      uVar11 = (ulong)uVar10;
    }
    uVar13 = 0;
    do {
      uVar14 = (ulong)pRVar3->elements[uVar13];
      pbVar18 = target + 1;
      *target = 0x50;
      uVar15 = uVar14;
      if (0x7f < uVar14) {
        do {
          *pbVar18 = (byte)uVar14 | 0x80;
          uVar15 = uVar14 >> 7;
          pbVar18 = pbVar18 + 1;
          bVar6 = 0x3fff < uVar14;
          uVar14 = uVar15;
        } while (bVar6);
      }
      *pbVar18 = (byte)uVar15;
      target = pbVar18 + 1;
      uVar13 = uVar13 + 1;
      pFVar16 = local_b0;
    } while (uVar13 != uVar11);
  }
  uVar10 = (pFVar16->weak_dependency_).current_size_;
  if (uVar10 != 0) {
    if ((pFVar16->weak_dependency_).rep_ == (Rep *)0x0) {
      internal::LogMessage::LogMessage
                (&local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x4e2);
      pLVar9 = internal::LogMessage::operator<<(&local_a0,"CHECK failed: rep_: ");
      internal::LogFinisher::operator=(&local_b1,pLVar9);
      internal::LogMessage::~LogMessage(&local_a0);
    }
    pRVar3 = (local_b0->weak_dependency_).rep_;
    uVar11 = 1;
    if (1 < (int)uVar10) {
      uVar11 = (ulong)uVar10;
    }
    uVar13 = 0;
    do {
      uVar14 = (ulong)pRVar3->elements[uVar13];
      pbVar18 = target + 1;
      *target = 0x58;
      uVar15 = uVar14;
      if (0x7f < uVar14) {
        do {
          *pbVar18 = (byte)uVar14 | 0x80;
          uVar15 = uVar14 >> 7;
          pbVar18 = pbVar18 + 1;
          bVar6 = 0x3fff < uVar14;
          uVar14 = uVar15;
        } while (bVar6);
      }
      *pbVar18 = (byte)uVar15;
      target = pbVar18 + 1;
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar11);
  }
  pFVar16 = local_b0;
  if ((uVar12 & 4) != 0) {
    psVar2 = (local_b0->syntax_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "google.protobuf.FileDescriptorProto.syntax");
    psVar2 = (pFVar16->syntax_).ptr_;
    *target = 0x62;
    target = io::CodedOutputStream::WriteStringWithSizeToArray(psVar2,target + 1);
  }
  pvVar4 = (pFVar16->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar4 & 1) != 0) {
    target = internal::WireFormat::SerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe),target);
  }
  return target;
}

Assistant:

::google::protobuf::uint8* FileDescriptorProto::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.FileDescriptorProto)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.name");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->name(), target);
  }

  // optional string package = 2;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->package().data(), this->package().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.package");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        2, this->package(), target);
  }

  // repeated string dependency = 3;
  for (int i = 0, n = this->dependency_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->dependency(i).data(), this->dependency(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.dependency");
    target = ::google::protobuf::internal::WireFormatLite::
      WriteStringToArray(3, this->dependency(i), target);
  }

  // repeated .google.protobuf.DescriptorProto message_type = 4;
  for (unsigned int i = 0, n = this->message_type_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        4, this->message_type(i), deterministic, target);
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 5;
  for (unsigned int i = 0, n = this->enum_type_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        5, this->enum_type(i), deterministic, target);
  }

  // repeated .google.protobuf.ServiceDescriptorProto service = 6;
  for (unsigned int i = 0, n = this->service_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        6, this->service(i), deterministic, target);
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 7;
  for (unsigned int i = 0, n = this->extension_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        7, this->extension(i), deterministic, target);
  }

  // optional .google.protobuf.FileOptions options = 8;
  if (cached_has_bits & 0x00000008u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        8, *this->options_, deterministic, target);
  }

  // optional .google.protobuf.SourceCodeInfo source_code_info = 9;
  if (cached_has_bits & 0x00000010u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        9, *this->source_code_info_, deterministic, target);
  }

  // repeated int32 public_dependency = 10;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteInt32ToArray(10, this->public_dependency_, target);

  // repeated int32 weak_dependency = 11;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteInt32ToArray(11, this->weak_dependency_, target);

  // optional string syntax = 12;
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->syntax().data(), this->syntax().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.syntax");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        12, this->syntax(), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.FileDescriptorProto)
  return target;
}